

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O2

void * Cnf_DataWriteIntoSolver2(Cnf_Dat_t *p,int nFrames,int fInit)

{
  Vec_Ptr_t *p_00;
  int iVar1;
  int iVar2;
  sat_solver2 *s;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t *pAVar4;
  long lVar5;
  ulong uVar6;
  void *pvVar7;
  uint uVar8;
  int iVar9;
  undefined8 local_58;
  int local_50;
  int local_4c;
  int local_48;
  int Lits [1];
  int *local_40;
  ulong local_38;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                  ,0x1e3,"void *Cnf_DataWriteIntoSolver2(Cnf_Dat_t *, int, int)");
  }
  s = sat_solver2_new();
  sat_solver2_setnvars(s,p->nVars * nFrames);
  lVar5 = 0;
  do {
    if (p->nClauses <= lVar5) {
      if (nFrames != 1) {
        local_50 = p->nVars * 2;
        local_40 = *p->pClauses;
        uVar6 = 1;
        local_4c = nFrames;
        local_48 = fInit;
        while (iVar1 = (int)uVar6, iVar1 != local_4c) {
          iVar9 = (iVar1 + -1) * local_50;
          uVar8 = iVar1 * local_50;
          iVar1 = 0;
          local_38 = uVar6;
          while (iVar1 < p->pMan->nRegs) {
            pAVar3 = Aig_ManLi(p->pMan,iVar1);
            pAVar4 = Aig_ManLo(p->pMan,iVar1);
            local_58 = CONCAT44((uVar8 | 1) + p->pVarNums[pAVar4->Id] * 2,
                                iVar9 + p->pVarNums[pAVar3->Id] * 2);
            iVar2 = sat_solver2_addclause(s,(lit *)&local_58,&local_50,0);
            if (iVar2 == 0) goto LAB_0046c92d;
            local_58 = CONCAT44((int)((ulong)local_58 >> 0x20) + -1,(int)local_58 + 1);
            iVar2 = sat_solver2_addclause(s,(lit *)&local_58,&local_50,0);
            iVar1 = iVar1 + 1;
            if (iVar2 == 0) goto LAB_0046c92d;
          }
          for (lVar5 = 0; lVar5 < p->nLiterals; lVar5 = lVar5 + 1) {
            local_40[lVar5] = local_40[lVar5] + local_50;
          }
          lVar5 = 0;
          while (lVar5 < p->nClauses) {
            iVar1 = sat_solver2_addclause(s,p->pClauses[lVar5],p->pClauses[lVar5 + 1],0);
            lVar5 = lVar5 + 1;
            if (iVar1 == 0) goto LAB_0046c92d;
          }
          uVar6 = (ulong)((int)local_38 + 1);
        }
        for (lVar5 = 0; fInit = local_48, lVar5 < p->nLiterals; lVar5 = lVar5 + 1) {
          local_40[lVar5] = local_40[lVar5] - (local_4c + -1) * local_50;
        }
      }
      goto LAB_0046c948;
    }
    iVar1 = sat_solver2_addclause(s,p->pClauses[lVar5],p->pClauses[lVar5 + 1],0);
    lVar5 = lVar5 + 1;
  } while (iVar1 != 0);
  goto LAB_0046c7cd;
LAB_0046c92d:
  sat_solver2_delete(s);
  fInit = local_48;
  if ((int)local_38 < local_4c) {
    return (void *)0x0;
  }
LAB_0046c948:
  if (fInit == 0) {
LAB_0046c9a6:
    iVar1 = sat_solver2_simplify(s);
    if (iVar1 != 0) {
      return s;
    }
  }
  else {
    iVar1 = p->pMan->nObjs[2] - p->pMan->nRegs;
    do {
      p_00 = p->pMan->vCis;
      if (p_00->nSize <= iVar1) goto LAB_0046c9a6;
      pvVar7 = Vec_PtrEntry(p_00,iVar1);
      Lits[0] = p->pVarNums[*(int *)((long)pvVar7 + 0x24)] * 2 + 1;
      iVar9 = sat_solver2_addclause(s,Lits,(lit *)&local_40,0);
      iVar1 = iVar1 + 1;
    } while (iVar9 != 0);
  }
LAB_0046c7cd:
  sat_solver2_delete(s);
  return (void *)0x0;
}

Assistant:

void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit )
{
    sat_solver2 * pSat;
    int i, f, status;
    assert( nFrames > 0 );
    pSat = sat_solver2_new();
    sat_solver2_setnvars( pSat, p->nVars * nFrames );
    for ( i = 0; i < p->nClauses; i++ )
    {
        if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
        {
            sat_solver2_delete( pSat );
            return NULL;
        }
    }
    if ( nFrames > 1 )
    {
        Aig_Obj_t * pObjLo, * pObjLi;
        int nLitsAll, * pLits, Lits[2];
        nLitsAll = 2 * p->nVars;
        pLits = p->pClauses[0];
        for ( f = 1; f < nFrames; f++ )
        {
            // add equality of register inputs/outputs for different timeframes
            Aig_ManForEachLiLoSeq( p->pMan, pObjLi, pObjLo, i )
            {
                Lits[0] = (f-1)*nLitsAll + toLitCond( p->pVarNums[pObjLi->Id], 0 );
                Lits[1] =  f   *nLitsAll + toLitCond( p->pVarNums[pObjLo->Id], 1 );
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
                Lits[0]++;
                Lits[1]--;
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
            // add clauses for the next timeframe
            for ( i = 0; i < p->nLiterals; i++ )
                pLits[i] += nLitsAll;
            for ( i = 0; i < p->nClauses; i++ )
            {
                if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
        }
        // return literals to their original state
        nLitsAll = (f-1) * nLitsAll;
        for ( i = 0; i < p->nLiterals; i++ )
            pLits[i] -= nLitsAll;
    }
    if ( fInit )
    {
        Aig_Obj_t * pObjLo;
        int Lits[1];
        Aig_ManForEachLoSeq( p->pMan, pObjLo, i )
        {
            Lits[0] = toLitCond( p->pVarNums[pObjLo->Id], 1 );
            if ( !sat_solver2_addclause( pSat, Lits, Lits + 1, 0 ) )
            {
                sat_solver2_delete( pSat );
                return NULL;
            }
        }
    }
    status = sat_solver2_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver2_delete( pSat );
        return NULL;
    }
    return pSat;
}